

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# math.cpp
# Opt level: O1

float NULLCMath::normalize2(float4 *v)

{
  float fVar1;
  
  fVar1 = v->x * v->x + v->y * v->y;
  if (fVar1 < 0.0) {
    fVar1 = sqrtf(fVar1);
  }
  else {
    fVar1 = SQRT(fVar1);
  }
  v->x = v->x * (1.0 / fVar1);
  v->y = (1.0 / fVar1) * v->y;
  return fVar1;
}

Assistant:

float normalize2(float4* v)
	{
		float len = length2(v), invLen = 1.0f / len;
		v->x *= invLen;
		v->y *= invLen;
		return len;
	}